

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::preCalculation(ForceManager *this)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *this_00;
  long in_RDI;
  potVec zeroPot;
  Snapshot *snap;
  CutoffGroup *cg;
  CutoffGroupIterator ci;
  RigidBody *rb;
  RigidBodyIterator rbIter;
  Atom *atom;
  AtomIterator ai;
  Molecule *mol;
  MoleculeIterator mi;
  potVec *in_stack_fffffffffffffdd8;
  Snapshot *in_stack_fffffffffffffde0;
  Vector<double,_7U> *in_stack_fffffffffffffde8;
  SelectionSet *bs;
  StuntDouble *in_stack_fffffffffffffdf0;
  SelectionManager *this_01;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  Snapshot *this_02;
  Snapshot *this_03;
  SelectionSet local_1c8;
  double local_1b0;
  Vector<double,_3U> local_1a8;
  undefined1 local_190 [24];
  double local_178 [5];
  CutoffGroup *in_stack_fffffffffffffeb0;
  double local_90;
  Vector<double,_7U> local_88;
  Snapshot *local_50;
  CutoffGroup *local_48;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_40;
  RigidBody *local_38;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_30;
  Atom *local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  Molecule *local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_40);
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
  local_50 = SnapshotManager::getCurrentSnapshot(this_00);
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))(*(long **)(in_RDI + 0x30),local_50);
  Snapshot::setBondPotential(local_50,0.0);
  Snapshot::setBendPotential(local_50,0.0);
  Snapshot::setTorsionPotential(local_50,0.0);
  Snapshot::setInversionPotential(local_50,0.0);
  local_90 = 0.0;
  Vector<double,_7U>::Vector(&local_88,&local_90);
  Vector<double,_7U>::Vector
            ((Vector<double,_7U> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Snapshot::setLongRangePotentials(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_03 = local_50;
  Vector<double,_7U>::Vector
            ((Vector<double,_7U> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Snapshot::setExcludedPotentials(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
    Vector<double,_7U>::Vector
              ((Vector<double,_7U> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    Snapshot::setSelectionPotentials(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  local_178[0] = 0.0;
  this_02 = local_50;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(local_178 + 1),local_178);
  Snapshot::setSelfPotentials(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Snapshot::setRestraintPotential(local_50,0.0);
  Snapshot::setRawPotential(local_50,0.0);
  local_18 = SimInfo::beginMolecule
                       ((SimInfo *)this_02,
                        (MoleculeIterator *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  while (local_18 != (Molecule *)0x0) {
    local_28 = Molecule::beginAtom((Molecule *)this_02,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    while (local_28 != (Atom *)0x0) {
      StuntDouble::zeroForcesAndTorques(in_stack_fffffffffffffdf0);
      local_28 = Molecule::nextAtom((Molecule *)this_02,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    local_38 = Molecule::beginRigidBody
                         ((Molecule *)this_02,
                          (iterator *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
    ;
    while (local_38 != (RigidBody *)0x0) {
      StuntDouble::zeroForcesAndTorques(in_stack_fffffffffffffdf0);
      local_38 = Molecule::nextRigidBody
                           ((Molecule *)this_02,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    in_stack_fffffffffffffdfc = SimInfo::getNGlobalCutoffGroups(*(SimInfo **)(in_RDI + 0x18));
    iVar2 = SimInfo::getNGlobalAtoms(*(SimInfo **)(in_RDI + 0x18));
    if (in_stack_fffffffffffffdfc != iVar2) {
      local_48 = Molecule::beginCutoffGroup
                           ((Molecule *)this_02,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      while (local_48 != (CutoffGroup *)0x0) {
        CutoffGroup::updateCOM(in_stack_fffffffffffffeb0);
        local_48 = Molecule::nextCutoffGroup
                             ((Molecule *)this_02,
                              (iterator *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      }
    }
    local_18 = SimInfo::nextMolecule
                         ((SimInfo *)this_02,
                          (MoleculeIterator *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  RectMatrix<double,_3U,_3U>::operator*=
            ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffde0,
             (double)in_stack_fffffffffffffdd8);
  this_01 = *(SelectionManager **)(in_RDI + 0x30);
  local_1b0 = 0.0;
  Vector<double,_3U>::Vector(&local_1a8,&local_1b0);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffde0,
             (Vector<double,_3U> *)in_stack_fffffffffffffdd8);
  (*(code *)(this_01->info_->massFactors_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish)(this_01,local_190);
  if (((*(byte *)(in_RDI + 0x220) & 1) != 0) &&
     (bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x310)), bVar1)) {
    bs = &local_1c8;
    SelectionEvaluator::evaluate((SelectionEvaluator *)this_03);
    SelectionManager::setSelectionSet(this_01,bs);
    SelectionSet::~SelectionSet((SelectionSet *)0x144470);
  }
  return;
}

Assistant:

void ForceManager::preCalculation() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    // forces and potentials are zeroed here, before any are
    // accumulated.

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    fDecomp_->setSnapshot(snap);

    snap->setBondPotential(0.0);
    snap->setBendPotential(0.0);
    snap->setTorsionPotential(0.0);
    snap->setInversionPotential(0.0);

    potVec zeroPot(0.0);
    snap->setLongRangePotentials(zeroPot);

    snap->setExcludedPotentials(zeroPot);
    if (doPotentialSelection_) snap->setSelectionPotentials(zeroPot);

    snap->setSelfPotentials(0.0);
    snap->setRestraintPotential(0.0);
    snap->setRawPotential(0.0);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atom->zeroForcesAndTorques();
      }

      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->zeroForcesAndTorques();
      }

      if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          // calculate the center of mass of cutoff group
          cg->updateCOM();
        }
      }
    }

    // Zero out the virial tensor
    virialTensor *= 0.0;
    // Zero out the heatFlux
    fDecomp_->setHeatFlux(Vector3d(0.0));

    if (doPotentialSelection_) {
      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }
    }
  }